

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>
          (JavascriptArray *arr,ScriptContext *scriptContext)

{
  JavascriptString *obj;
  bool bVar1;
  BOOL BVar2;
  TypedArrayBase *pTVar3;
  anon_class_48_6_399da0b0 local_a0;
  anon_class_24_3_633237ca local_70;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  JavascriptString *res;
  JavascriptArray *arr_local;
  ScriptContext *scriptContext_local;
  bool pushedObject;
  uint32 length;
  
  local_58 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_58)->noJsReentrancy;
  ((ThreadContext *)local_58)->noJsReentrancy = true;
  res = (JavascriptString *)arr;
  arr_local = (JavascriptArray *)scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,arr);
  obj = res;
  scriptContext_local._4_4_ = 0;
  bVar1 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(&res->super_RecyclableObject);
  if (bVar1) {
    pTVar3 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(&obj->super_RecyclableObject);
  }
  else {
    pTVar3 = (TypedArrayBase *)0x0;
  }
  if (pTVar3 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    scriptContext_local._4_4_ =
         *(Type *)&res[1].super_RecyclableObject.super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    JsReentLock::MutateArrayObject((JsReentLock *)local_58);
    *(bool *)((long)local_58 + 0x108) = true;
  }
  else {
    scriptContext_local._4_4_ = (pTVar3->super_ArrayBufferParent).super_ArrayObject.length;
  }
  if ((scriptContext_local._4_4_ == 0) ||
     (BVar2 = ScriptContext::CheckObject((ScriptContext *)arr_local,res), BVar2 != 0)) {
    jsReentLock._24_8_ =
         JavascriptLibrary::GetEmptyString
                   ((JavascriptLibrary *)
                    (arr_local->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                    ptr);
  }
  else {
    jsReentLock._24_8_ =
         JavascriptLibrary::GetEmptyString
                   ((JavascriptLibrary *)
                    (arr_local->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                    ptr);
    local_a0.res = (JavascriptString **)&jsReentLock.m_savedNoJsReentrancy;
    local_a0.pushedObject = (bool *)((long)&scriptContext_local + 3);
    scriptContext_local._3_1_ = 0;
    local_a0.scriptContext = (ScriptContext **)&arr_local;
    local_a0.arr = (JavascriptArray **)&res;
    local_a0.length = (uint32 *)((long)&scriptContext_local + 4);
    local_a0.jsReentLock = (JsReentLock *)local_58;
    local_70.pushedObject = local_a0.pushedObject;
    local_70.scriptContext = local_a0.scriptContext;
    local_70.arr = local_a0.arr;
    TryFinally<Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>(Js::JavascriptArray*,Js::ScriptContext*)::_lambda()_1_,Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>(Js::JavascriptArray*,Js::ScriptContext*)::_lambda(bool)_1_>
              (&local_a0,&local_70);
    if (jsReentLock._24_8_ == 0) {
      jsReentLock._24_8_ =
           JavascriptLibrary::GetEmptyString
                     ((JavascriptLibrary *)
                      (arr_local->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                      .ptr);
    }
  }
  *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (JavascriptString *)jsReentLock._24_8_;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleString(T* arr, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = 0;
        TypedArrayBase * typedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(static_cast<RecyclableObject*>(arr));
        if (typedArray)
        {
            // For a TypedArray use the actual length of the array.
            length = typedArray->GetLength();
        }
        else
        {
            //For anything else, use the "length" property if present.
            JS_REENTRANT(jsReentLock, length = ItemTrace<T>::GetLength(arr, scriptContext));
        }

        if (length == 0 || scriptContext->CheckObject(arr))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        JavascriptString* res = scriptContext->GetLibrary()->GetEmptyString();
        bool pushedObject = false;

        TryFinally([&]()
        {
            scriptContext->PushObject(arr);
            pushedObject = true;

            Var element;
            JS_REENTRANT(jsReentLock, BOOL gotItem = ItemTrace<T>::GetItem(arr, 0, &element, scriptContext));
            if (gotItem)
            {
                JS_REENTRANT(jsReentLock, res = JavascriptArray::ToLocaleStringHelper(element, scriptContext));
            }

            if (length > 1)
            {
                uint32 sepSize = 0;
                char16 szSeparator[Arrays::SeparatorBufferSize];

                bool hasLocaleSeparator = Arrays::GetLocaleSeparator(szSeparator, &sepSize, Arrays::SeparatorBufferSize);

                JavascriptString* separator = nullptr;

                if (hasLocaleSeparator)
                {
                    separator = JavascriptString::NewCopyBuffer(szSeparator, static_cast<charcount_t>(sepSize), scriptContext);
                }
                else
                {
                    separator = scriptContext->GetLibrary()->GetCommaDisplayString();
                }

                for (uint32 i = 1; i < length; i++)
                {
                    res = JavascriptString::Concat(res, separator);
                    JS_REENTRANT(jsReentLock, gotItem = ItemTrace<T>::GetItem(arr, i, &element, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, res = JavascriptString::Concat(res, JavascriptArray::ToLocaleStringHelper(element, scriptContext)));
                    }
                }
            }
        },
        [&](bool/*hasException*/)
        {
            if (pushedObject)
            {
                Var top = scriptContext->PopObject();
                AssertMsg(top == arr, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }